

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aes.c
# Opt level: O0

int aesni_ocb_init_key(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc)

{
  int iVar1;
  void *keyenc;
  undefined4 in_ECX;
  void *in_RDX;
  block128_f in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  size_t in_stack_00000010;
  EVP_AES_OCB_CTX *octx;
  undefined4 in_stack_00000020;
  EVP_CIPHER_CTX *in_stack_00000050;
  block128_f in_stack_ffffffffffffffb8;
  block128_f encrypt;
  undefined4 in_stack_ffffffffffffffd8;
  void *local_20;
  
  keyenc = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  if ((in_RDX != (void *)0x0) || (in_RSI != (block128_f)0x0)) {
    if (in_RSI == (block128_f)0x0) {
      if (*(int *)((long)keyenc + 0x1f0) == 0) {
        memcpy(*(void **)((long)keyenc + 0x2a8),in_RDX,(long)*(int *)((long)keyenc + 0x2e8));
      }
      else {
        CRYPTO_ocb128_setiv((OCB128_CONTEXT *)iv,(uchar *)CONCAT44(enc,in_stack_00000020),
                            (size_t)octx,in_stack_00000010);
      }
      *(undefined4 *)((long)keyenc + 500) = 1;
    }
    else {
      encrypt = in_RSI;
      iVar1 = EVP_CIPHER_CTX_get_key_length(in_stack_00000050);
      aesni_set_encrypt_key(encrypt,iVar1 << 3,keyenc);
      iVar1 = EVP_CIPHER_CTX_get_key_length(in_stack_00000050);
      aesni_set_decrypt_key(in_RSI,iVar1 << 3,(long)keyenc + 0xf8);
      iVar1 = CRYPTO_ocb128_init((OCB128_CONTEXT *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),keyenc
                                 ,in_RSI,encrypt,in_stack_ffffffffffffffb8,(ocb128_f)0x25f5c1);
      if (iVar1 == 0) {
        return 0;
      }
      local_20 = in_RDX;
      if ((in_RDX == (void *)0x0) && (*(int *)((long)keyenc + 500) != 0)) {
        local_20 = *(void **)((long)keyenc + 0x2a8);
      }
      if (local_20 != (void *)0x0) {
        iVar1 = CRYPTO_ocb128_setiv((OCB128_CONTEXT *)iv,(uchar *)CONCAT44(enc,in_stack_00000020),
                                    (size_t)octx,in_stack_00000010);
        if (iVar1 != 1) {
          return 0;
        }
        *(undefined4 *)((long)keyenc + 500) = 1;
      }
      *(undefined4 *)((long)keyenc + 0x1f0) = 1;
    }
  }
  return 1;
}

Assistant:

static int aesni_ocb_init_key(EVP_CIPHER_CTX *ctx, const unsigned char *key,
                              const unsigned char *iv, int enc)
{
    EVP_AES_OCB_CTX *octx = EVP_C_DATA(EVP_AES_OCB_CTX,ctx);
    if (!iv && !key)
        return 1;
    if (key) {
        do {
            /*
             * We set both the encrypt and decrypt key here because decrypt
             * needs both. We could possibly optimise to remove setting the
             * decrypt for an encryption operation.
             */
            aesni_set_encrypt_key(key, EVP_CIPHER_CTX_get_key_length(ctx) * 8,
                                  &octx->ksenc.ks);
            aesni_set_decrypt_key(key, EVP_CIPHER_CTX_get_key_length(ctx) * 8,
                                  &octx->ksdec.ks);
            if (!CRYPTO_ocb128_init(&octx->ocb,
                                    &octx->ksenc.ks, &octx->ksdec.ks,
                                    (block128_f) aesni_encrypt,
                                    (block128_f) aesni_decrypt,
                                    enc ? aesni_ocb_encrypt
                                        : aesni_ocb_decrypt))
                return 0;
        }
        while (0);

        /*
         * If we have an iv we can set it directly, otherwise use saved IV.
         */
        if (iv == NULL && octx->iv_set)
            iv = octx->iv;
        if (iv) {
            if (CRYPTO_ocb128_setiv(&octx->ocb, iv, octx->ivlen, octx->taglen)
                != 1)
                return 0;
            octx->iv_set = 1;
        }
        octx->key_set = 1;
    } else {
        /* If key set use IV, otherwise copy */
        if (octx->key_set)
            CRYPTO_ocb128_setiv(&octx->ocb, iv, octx->ivlen, octx->taglen);
        else
            memcpy(octx->iv, iv, octx->ivlen);
        octx->iv_set = 1;
    }
    return 1;
}